

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::GlobalValueChangeFunc::GlobalValueChangeFunc
          (GlobalValueChangeFunc *this,KnownSystemName knownNameId,bool isFuture)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005b12f8;
  this->isFuture = isFuture;
  return;
}

Assistant:

GlobalValueChangeFunc(KnownSystemName knownNameId, bool isFuture) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), isFuture(isFuture) {}